

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O1

GroupInfo * __thiscall
C3DFile::readGroupInfo(GroupInfo *__return_storage_ptr__,C3DFile *this,ifstream *datastream)

{
  char *pcVar1;
  
  __return_storage_ptr__->name_length = -1;
  __return_storage_ptr__->id = -1;
  __return_storage_ptr__->name = (char *)0x0;
  __return_storage_ptr__->next_offset = -1;
  __return_storage_ptr__->descr_length = -1;
  __return_storage_ptr__->description = (char *)0x0;
  __return_storage_ptr__->locked = false;
  std::istream::read((char *)datastream,(long)__return_storage_ptr__);
  if (__return_storage_ptr__->name != (char *)0x0) {
    __assert_fail("result.name == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0xc1,"GroupInfo C3DFile::readGroupInfo(ifstream &)");
  }
  if (__return_storage_ptr__->name_length < '\0') {
    __return_storage_ptr__->name_length = -__return_storage_ptr__->name_length;
  }
  pcVar1 = (char *)operator_new__((long)__return_storage_ptr__->name_length + 1);
  __return_storage_ptr__->name = pcVar1;
  std::istream::read((char *)datastream,(long)pcVar1);
  __return_storage_ptr__->name[__return_storage_ptr__->name_length] = '\0';
  std::istream::read((char *)datastream,(long)&__return_storage_ptr__->next_offset);
  std::istream::read((char *)datastream,(long)&__return_storage_ptr__->descr_length);
  if (__return_storage_ptr__->description == (char *)0x0) {
    pcVar1 = (char *)operator_new__((long)__return_storage_ptr__->descr_length + 1);
    __return_storage_ptr__->description = pcVar1;
    std::istream::read((char *)datastream,(long)pcVar1);
    __return_storage_ptr__->description[__return_storage_ptr__->descr_length] = '\0';
    return __return_storage_ptr__;
  }
  __assert_fail("result.description == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                ,0xd0,"GroupInfo C3DFile::readGroupInfo(ifstream &)");
}

Assistant:

GroupInfo C3DFile::readGroupInfo (ifstream &datastream) {
	GroupInfo result;
	
	// read name_length and id
	datastream.read(reinterpret_cast<char *>(&result), sizeof(Sint8) * 2);

	assert(result.name == NULL);
	if (result.name_length < 0) {
		result.name_length *= -1;
	}
	if (result.name_length > 127) {
		cerr << "Invalid group name length in C3D file!" << endl;
		abort();
	}
	result.name = new char[result.name_length + 1];
	datastream.read(result.name, result.name_length);
	result.name[result.name_length] = 0;

	datastream.read(reinterpret_cast<char *>(&result.next_offset), sizeof(Sint16));
	datastream.read(reinterpret_cast<char *>(&result.descr_length), sizeof(Sint8));

	assert(result.description == NULL);
	result.description = new char[result.descr_length + 1];
	datastream.read(result.description, result.descr_length);
	result.description[result.descr_length] = 0;

	return result;
}